

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_typed_tests.hpp
# Opt level: O0

void __thiscall
iutest::detail::
TypeParamTestInstance<iu_StringSplitLvalue_x_iutest_x_chain_at_first_back_by_stl_str_Test,_iutest::detail::VariadicTypeList<char,_wchar_t,_char16_t,_char32_t>_>
::EachTest<iutest::detail::VariadicTypeList<char,_wchar_t,_char16_t,_char32_t>,_void>::AddTest
          (EachTest<iutest::detail::VariadicTypeList<char,_wchar_t,_char16_t,_char32_t>,_void> *this
          )

{
  UnitTest *this_00;
  TestCase *pCase;
  EachTest<iutest::detail::VariadicTypeList<char,_wchar_t,_char16_t,_char32_t>,_void> *this_local;
  
  this_00 = UnitTest::instance();
  pCase = iuITestCaseMediator::ptr((iuITestCaseMediator *)this);
  UnitTestImpl::AddTestInfo(&this_00->super_UnitTestImpl,pCase,&this->m_info);
  TypeParamTestInstance<iu_StringSplitLvalue_x_iutest_x_chain_at_first_back_by_stl_str_Test,_iutest::detail::VariadicTypeList<char,_wchar_t,_char16_t,_char32_t>_>
  ::EachTest<iutest::detail::VariadicTypeList<wchar_t,_char16_t,_char32_t>,_void>::AddTest
            (&this->m_next);
  return;
}

Assistant:

void AddTest()
        {
            // 順番通りになるように前から登録
            UnitTest::instance().AddTestInfo(m_mediator.ptr(), &m_info);
            m_next.AddTest();
        }